

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall roundTrip_DebugTest_Test::TestBody(roundTrip_DebugTest_Test *this)

{
  uint64_t uVar1;
  precise_unit *un;
  uint64_t in_RCX;
  char *message;
  precise_unit pVar2;
  unit local_a8;
  unit local_a0;
  AssertionResult gtest_ar;
  precise_unit u1;
  string local_70;
  string str;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"1*ampere90",(allocator *)&str);
  uVar1 = units::getDefaultFlags();
  pVar2 = units::unit_from_string(&local_30,uVar1);
  u1._8_8_ = pVar2._8_8_;
  u1.multiplier_ = pVar2.multiplier_;
  std::__cxx11::string::~string((string *)&local_30);
  un = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&str,(units *)&u1,un,in_RCX);
  std::__cxx11::string::string((string *)&local_70,(string *)&str);
  uVar1 = units::getDefaultFlags();
  pVar2 = units::unit_from_string(&local_70,uVar1);
  std::__cxx11::string::~string((string *)&local_70);
  local_a0 = (unit)((ulong)(uint)(float)pVar2.multiplier_ | pVar2._8_8_ << 0x20);
  local_a8.multiplier_ = (float)u1.multiplier_;
  local_a8.base_units_ = u1.base_units_;
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            ((internal *)&gtest_ar,"unit_cast(u2)","unit_cast(u1)",&local_a0,&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3fb,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if (local_a0 != (unit)0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

TEST(roundTrip, DebugTest)
{
    auto u1 = unit_from_string("1*ampere90");
    auto str = to_string(u1);
    auto u2 = unit_from_string(str);
    EXPECT_EQ(unit_cast(u2), unit_cast(u1));
}